

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.h
# Opt level: O0

void quicly_sentmap_commit(quicly_sentmap_t *map,uint16_t bytes_in_flight)

{
  int iVar1;
  ushort in_SI;
  quicly_sentmap_t *in_RDI;
  
  iVar1 = quicly_sentmap_is_open(in_RDI);
  if (iVar1 != 0) {
    if (in_SI != 0) {
      *(byte *)((long)&in_RDI->_pending_packet->data + 0x11) =
           *(byte *)((long)&in_RDI->_pending_packet->data + 0x11) & 0xfe | 1;
      (in_RDI->_pending_packet->data).packet.cc_bytes_in_flight = in_SI;
      in_RDI->bytes_in_flight = (ulong)in_SI + in_RDI->bytes_in_flight;
    }
    *(byte *)((long)&in_RDI->_pending_packet->data + 0x11) =
         *(byte *)((long)&in_RDI->_pending_packet->data + 0x11) & 0xfd | 2;
    in_RDI->_pending_packet = (quicly_sent_t *)0x0;
    in_RDI->num_packets = in_RDI->num_packets + 1;
    return;
  }
  __assert_fail("quicly_sentmap_is_open(map)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                ,0x10c,"void quicly_sentmap_commit(quicly_sentmap_t *, uint16_t)");
}

Assistant:

inline void quicly_sentmap_commit(quicly_sentmap_t *map, uint16_t bytes_in_flight)
{
    assert(quicly_sentmap_is_open(map));

    if (bytes_in_flight != 0) {
        map->_pending_packet->data.packet.ack_eliciting = 1;
        map->_pending_packet->data.packet.cc_bytes_in_flight = bytes_in_flight;
        map->bytes_in_flight += bytes_in_flight;
    }
    map->_pending_packet->data.packet.frames_in_flight = 1;
    map->_pending_packet = NULL;

    ++map->num_packets;
}